

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O3

void __thiscall BtorSimVCDWriter::write_node_header(BtorSimVCDWriter *this,ModuleTreeNode *top)

{
  ofstream *poVar1;
  pointer ppMVar2;
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  char *__s;
  pointer ppMVar12;
  int64_t id;
  string symbol;
  pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  i;
  string am_ident;
  string idx;
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  j;
  char *local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  char *local_130;
  long local_128;
  char local_120 [16];
  char *local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  char *local_c0;
  long local_b8;
  char local_b0 [16];
  pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
  *local_58;
  ModuleTreeNode *local_50;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  BtorSimVCDWriter *local_40;
  _Rb_tree_node_base *local_38;
  
  poVar1 = &this->vcd_file;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$scope module ",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(top->name)._M_dataplus._M_p,(top->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," $end\n",6);
  p_Var6 = (top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(top->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50 = top;
  if (p_Var6 != local_38) {
    local_48 = &this->bv_identifiers;
    local_138 = &(this->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = &this->clocks;
    local_140 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header;
    pmVar3 = &this->am_identifiers;
    local_40 = this;
    do {
      local_110 = *(char **)(p_Var6 + 1);
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,p_Var6[1]._M_parent,
                 (long)&(p_Var6[1]._M_parent)->_M_color + (long)&(p_Var6[1]._M_left)->_M_color);
      local_e8 = *(undefined4 *)&p_Var6[2]._M_parent;
      local_148 = local_110;
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_108,local_108 + local_100);
      p_Var10 = (this->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = local_138;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_0010c0b2:
        for (p_Var5 = (this->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          std::
          pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair(&local_a0,
                 (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(p_Var5 + 1));
          if ((char *)local_a0.first.first == local_148) {
            local_c0 = local_b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,local_a0.first.second._M_dataplus._M_p,
                       local_a0.first.second._M_dataplus._M_p +
                       local_a0.first.second._M_string_length);
            local_e0 = local_d0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_a0.second._M_dataplus._M_p,
                       local_a0.second._M_dataplus._M_p + local_a0.second._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$var wire ",10);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_e0,local_d8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_130,local_128);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<",1);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c0,local_b8);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"> $end\n",7);
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            if (local_c0 != local_b0) {
              operator_delete(local_c0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.second._M_dataplus._M_p != &local_a0.second.field_2) {
            operator_delete(local_a0.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0.first.second._M_dataplus._M_p != &local_a0.first.second.field_2) {
            operator_delete(local_a0.first.second._M_dataplus._M_p);
          }
        }
      }
      else {
        do {
          if ((long)local_148 <= *(long *)(p_Var10 + 1)) {
            p_Var11 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(long *)(p_Var10 + 1) < (long)local_148];
        } while (p_Var10 != (_Base_ptr)0x0);
        if ((p_Var11 == local_138) || ((long)local_148 < *(long *)(p_Var11 + 1))) goto LAB_0010c0b2;
        p_Var10 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        __s = "wire";
        p_Var11 = local_140;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            if ((long)local_148 <= *(long *)(p_Var10 + 1)) {
              p_Var11 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(long *)(p_Var10 + 1) < (long)local_148];
          } while (p_Var10 != (_Base_ptr)0x0);
          __s = "wire";
          if ((p_Var11 != local_140) && (__s = "wire", *(long *)(p_Var11 + 1) <= (long)local_148)) {
            pmVar7 = std::
                     map<long,_BtorSimVCDWriter::ClkType,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
                     ::operator[](local_58,(key_type *)&local_148);
            __s = "wire";
            if (*pmVar7 == EVENT) {
              __s = "event";
            }
          }
        }
        local_a0.first.first = (long)&local_a0.first.second._M_string_length;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,__s,__s + sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$var ",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,(char *)local_a0.first.first,
                            (long)local_a0.first.second._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pmVar9 = std::
                 map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_48,(key_type *)&local_110);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(pmVar9->_M_dataplus)._M_p,pmVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_130,local_128);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," $end\n",6);
        if ((size_type *)local_a0.first.first != &local_a0.first.second._M_string_length) {
          operator_delete((void *)local_a0.first.first);
        }
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
      this = local_40;
      if (local_108 != local_f8) {
        operator_delete(local_108);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_38);
  }
  ppMVar2 = (local_50->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar12 = (local_50->submodules).
                  super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar12 != ppMVar2; ppMVar12 = ppMVar12 + 1) {
    write_node_header(this,*ppMVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"$upscope $end\n",0xe);
  return;
}

Assistant:

void
BtorSimVCDWriter::write_node_header (ModuleTreeNode* top)
{
  vcd_file << "$scope module " << top->name << " $end\n";
  for (auto i : top->wire_names)
  {
    int64_t id         = i.first;
    std::string symbol = i.second.first;
    uint32_t width     = i.second.second;
    if (bv_identifiers.find (id) != bv_identifiers.end ())
    {
      std::string type =
          (clocks.find (id) != clocks.end () && clocks[id] == EVENT) ? "event"
                                                                     : "wire";
      vcd_file << "$var " << type << " " << width << " "
               << bv_identifiers[i.first] << " " << symbol << " $end\n";
    }
    else
      for (auto j : am_identifiers)
      {
        if (j.first.first == id)
        {
          std::string idx      = j.first.second;
          std::string am_ident = j.second;
          vcd_file << "$var wire " << width << " " << am_ident << " " << symbol
                   << "<" << std::hex << idx << std::dec << "> $end\n";
        }
      }
  }
  for (ModuleTreeNode* s : top->submodules)
  {
    write_node_header (s);
  }
  vcd_file << "$upscope $end\n";
}